

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tools_common.c
# Opt level: O2

void aom_img_write_nv12(aom_image_t *img,FILE *file)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t __size;
  uchar *__ptr;
  int iVar5;
  aom_img_fmt_t aVar6;
  uchar *puVar7;
  uchar *puVar8;
  long lVar9;
  int iVar10;
  uchar *local_78;
  
  puVar8 = img->planes[0];
  iVar1 = img->stride[0];
  iVar3 = aom_img_plane_width(img,0);
  aVar6 = img->fmt;
  iVar4 = aom_img_plane_height(img,0);
  iVar10 = 0;
  if (0 < iVar4) {
    iVar10 = iVar4;
  }
  while (iVar10 != 0) {
    fwrite(puVar8,1,(long)(iVar3 << ((byte)(aVar6 >> 0xb) & 1)),(FILE *)file);
    puVar8 = puVar8 + iVar1;
    iVar10 = iVar10 + -1;
  }
  puVar8 = img->planes[1];
  puVar7 = img->planes[2];
  aVar6 = img->fmt & 0x800;
  __size = 2 - (ulong)(aVar6 == AOM_IMG_FMT_NONE);
  iVar1 = img->stride[1];
  iVar4 = aom_img_plane_width(img,1);
  iVar3 = aom_img_plane_height(img,1);
  iVar5 = 0;
  iVar10 = iVar4;
  if (iVar4 < 1) {
    iVar10 = iVar5;
  }
  if (iVar3 < 1) {
    iVar3 = iVar5;
  }
  for (; __ptr = puVar8, lVar9 = (long)iVar4 << (sbyte)(aVar6 >> 0xb), local_78 = puVar7,
      iVar2 = iVar10, iVar5 != iVar3; iVar5 = iVar5 + 1) {
    while (iVar2 != 0) {
      fwrite(__ptr,__size,1,(FILE *)file);
      fwrite(local_78,__size,1,(FILE *)file);
      __ptr = __ptr + __size;
      lVar9 = lVar9 - __size;
      local_78 = local_78 + __size;
      iVar2 = iVar2 + -1;
    }
    puVar8 = puVar8 + (iVar1 - lVar9);
    puVar7 = puVar7 + (iVar1 - lVar9);
  }
  return;
}

Assistant:

void aom_img_write_nv12(const aom_image_t *img, FILE *file) {
  // Y plane
  const unsigned char *buf = img->planes[0];
  int stride = img->stride[0];
  int w = aom_img_plane_width(img, 0) *
          ((img->fmt & AOM_IMG_FMT_HIGHBITDEPTH) ? 2 : 1);
  int h = aom_img_plane_height(img, 0);
  int x, y;

  for (y = 0; y < h; ++y) {
    fwrite(buf, 1, w, file);
    buf += stride;
  }

  // Interleaved U and V plane
  const unsigned char *ubuf = img->planes[1];
  const unsigned char *vbuf = img->planes[2];
  const size_t size = (img->fmt & AOM_IMG_FMT_HIGHBITDEPTH) ? 2 : 1;
  stride = img->stride[1];
  w = aom_img_plane_width(img, 1);
  h = aom_img_plane_height(img, 1);

  for (y = 0; y < h; ++y) {
    for (x = 0; x < w; ++x) {
      fwrite(ubuf, size, 1, file);
      fwrite(vbuf, size, 1, file);
      ubuf += size;
      vbuf += size;
    }
    ubuf += (stride - w * size);
    vbuf += (stride - w * size);
  }
}